

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getTable
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,Name *table)

{
  bool bVar1;
  ulong pos_00;
  reference this_00;
  pointer u;
  allocator<char> local_69;
  string local_68;
  Err local_48;
  Name *local_28;
  Name *table_local;
  ParseDefsCtx *pPStack_18;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  local_28 = table;
  table_local._4_4_ = pos;
  pPStack_18 = this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  if (table == (Name *)0x0) {
    bVar1 = std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::empty(&this->wasm->tables);
    if (bVar1) {
      pos_00 = (ulong)table_local._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"table required, but there is no table",&local_69);
      Lexer::err(&local_48,&this->in,pos_00,&local_68);
      Result<wasm::Name>::Result(__return_storage_ptr__,&local_48);
      wasm::Err::~Err(&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    else {
      this_00 = std::
                vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ::operator[](&this->wasm->tables,0);
      u = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_00);
      Result<wasm::Name>::Result<wasm::Name&>(__return_storage_ptr__,(Name *)u);
    }
  }
  else {
    Result<wasm::Name>::Result<wasm::Name&>(__return_storage_ptr__,table);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getTable(Index pos, Name* table) {
    if (table) {
      return *table;
    }
    if (wasm.tables.empty()) {
      return in.err(pos, "table required, but there is no table");
    }
    return wasm.tables[0]->name;
  }